

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O2

void pd_defaultsymbol(t_pd *x,t_symbol *s)

{
  t_listmethod p_Var1;
  t_atom at;
  
  p_Var1 = (*x)->c_listmethod;
  at.a_w.w_symbol = s;
  if (p_Var1 == pd_defaultlist) {
    at.a_type = A_SYMBOL;
    (*(*x)->c_anymethod)(x,&s_symbol,1,&at);
  }
  else {
    at.a_type = A_SYMBOL;
    (*p_Var1)(x,(t_symbol *)0x0,1,&at);
  }
  return;
}

Assistant:

static void pd_defaultsymbol(t_pd *x, t_symbol *s)
{
    if (*(*x)->c_listmethod != pd_defaultlist)
    {
        t_atom at;
        SETSYMBOL(&at, s);
        (*(*x)->c_listmethod)(x, 0, 1, &at);
    }
    else
    {
        t_atom at;
        SETSYMBOL(&at, s);
        (*(*x)->c_anymethod)(x, &s_symbol, 1, &at);
    }
}